

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionCall4(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   ExprBase *arg1,ExprBase *arg2,ExprBase *arg3,bool allowFailure,bool allowInternal
                   ,bool allowFastLookup)

{
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments_00;
  ArgumentData local_138;
  SmallArray<ArgumentData,_4U> arguments;
  
  SmallArray<ArgumentData,_4U>::SmallArray(&arguments,ctx->allocator);
  local_138.source = arg0->source;
  local_138.type = arg0->type;
  local_138.isExplicit = false;
  local_138.name = (SynIdentifier *)0x0;
  local_138.valueFunction = (FunctionData *)0x0;
  local_138.value = arg0;
  SmallArray<ArgumentData,_4U>::push_back(&arguments,&local_138);
  local_138.source = arg1->source;
  local_138.type = arg1->type;
  local_138.isExplicit = false;
  local_138.name = (SynIdentifier *)0x0;
  local_138.valueFunction = (FunctionData *)0x0;
  local_138.value = arg1;
  SmallArray<ArgumentData,_4U>::push_back(&arguments,&local_138);
  local_138.source = arg2->source;
  local_138.type = arg2->type;
  local_138.isExplicit = false;
  local_138.name = (SynIdentifier *)0x0;
  local_138.value = arg2;
  local_138.valueFunction = (FunctionData *)0x0;
  SmallArray<ArgumentData,_4U>::push_back(&arguments,&local_138);
  local_138.source = arg3->source;
  local_138.type = arg3->type;
  local_138.isExplicit = false;
  local_138.name = (SynIdentifier *)0x0;
  local_138.value = arg3;
  local_138.valueFunction = (FunctionData *)0x0;
  SmallArray<ArgumentData,_4U>::push_back(&arguments,&local_138);
  arguments_00._12_4_ = 0;
  arguments_00.data = arguments.data;
  arguments_00.count = arguments.count;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name,arguments_00,allowFailure,allowInternal,allowFastLookup);
  SmallArray<ArgumentData,_4U>::~SmallArray(&arguments);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall4(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, ExprBase *arg1, ExprBase *arg2, ExprBase *arg3, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 4> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));
	arguments.push_back(ArgumentData(arg1->source, false, NULL, arg1->type, arg1));
	arguments.push_back(ArgumentData(arg2->source, false, NULL, arg2->type, arg2));
	arguments.push_back(ArgumentData(arg3->source, false, NULL, arg3->type, arg3));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}